

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setTextFormat(QLabel *this,TextFormat format)

{
  long lVar1;
  bool bVar2;
  QLabelPrivate *pQVar3;
  TextFormat in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLabelPrivate *d;
  QString t;
  QString *in_stack_ffffffffffffffb8;
  QString *text;
  QLabel *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  text = in_RDI;
  pQVar3 = d_func((QLabel *)0x5b2dae);
  if (in_ESI != pQVar3->textformat) {
    pQVar3->textformat = in_ESI;
    this_00 = (QLabel *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_RDI,in_stack_ffffffffffffffb8);
    bVar2 = QString::isNull((QString *)0x5b2e1b);
    if (!bVar2) {
      QString::clear(in_RDI);
      setText(this_00,text);
    }
    QString::~QString((QString *)0x5b2e49);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setTextFormat(Qt::TextFormat format)
{
    Q_D(QLabel);
    if (format != d->textformat) {
        d->textformat = format;
        QString t = d->text;
        if (!t.isNull()) {
            d->text.clear();
            setText(t);
        }
    }
}